

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Property::Property(Property *this,Attribute *a,bool custom)

{
  Attribute::Attribute(&this->_attrib,a);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  Relationship::Relationship(&this->_rel);
  (this->_prop_value_type_name)._M_dataplus._M_p = (pointer)&(this->_prop_value_type_name).field_2;
  (this->_prop_value_type_name)._M_string_length = 0;
  (this->_prop_value_type_name).field_2._M_local_buf[0] = '\0';
  this->_has_custom = custom;
  this->_type = Attrib;
  return;
}

Assistant:

Property(const Attribute &a, bool custom = false)
      : _attrib(a), _has_custom(custom) {
    _type = Type::Attrib;
  }